

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O2

void xml_parser_error(xml_parser *parser,xml_parser_offset offset,char *message)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar4 = (long)offset + parser->position;
  if (parser->length < uVar4) {
    uVar4 = parser->length;
  }
  uVar2 = 0;
  iVar3 = 0;
  for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    bVar6 = parser->buffer[uVar5] == '\n';
    uVar1 = (int)uVar2 + 1;
    if (bVar6) {
      uVar1 = 0;
    }
    uVar2 = (ulong)uVar1;
    iVar3 = iVar3 + (uint)bVar6;
  }
  if (offset == NO_CHARACTER) {
    fprintf(_stderr,"xml_parser_error at %i:%i: %s\n",(ulong)(iVar3 + 1),uVar2,message);
    return;
  }
  fprintf(_stderr,"xml_parser_error at %i:%i (is %c): %s\n",(ulong)(iVar3 + 1),uVar2,
          (ulong)parser->buffer[uVar4]);
  return;
}

Assistant:

static void xml_parser_error(struct xml_parser* parser, enum xml_parser_offset offset, char const* message) {
	int row = 0;
	int column = 0;

	#define min(X,Y) ((X) < (Y) ? (X) : (Y))
	#define max(X,Y) ((X) > (Y) ? (X) : (Y))
	size_t character = max(0, min(parser->length, parser->position + offset));
	#undef min
	#undef max

	size_t position = 0; for (; position < character; ++position) {
		column++;

		if ('\n' == parser->buffer[position]) {
			row++;
			column = 0;
		}
	}

	if (NO_CHARACTER != offset) {
		fprintf(stderr,	"xml_parser_error at %i:%i (is %c): %s\n",
				row + 1, column, parser->buffer[character], message
		);
	} else {
		fprintf(stderr,	"xml_parser_error at %i:%i: %s\n",
				row + 1, column, message
		);
	}
}